

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall
tf::Executor::
_corun_graph<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
          (Executor *this,Worker *w,Node *p,
          __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
          first,__normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
                last)

{
  bool bVar1;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  in_RCX;
  Node *in_RDX;
  Worker *in_RSI;
  Executor *in_RDI;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  in_R8;
  Executor *unaff_retaddr;
  AnchorGuard anchor;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  *in_stack_ffffffffffffff98;
  AnchorGuard local_30;
  
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
                      *)in_RDI,in_stack_ffffffffffffff98);
  if (!bVar1) {
    AnchorGuard::AnchorGuard(&local_30,in_RDX);
    _schedule_graph_with_parent<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
              (in_RDI,in_RSI,in_RCX,in_R8,in_RDX);
    _corun_until<tf::Executor::_corun_graph<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>(tf::Worker&,tf::Node*,__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>,__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>)::_lambda()_1_>
              (unaff_retaddr,(Worker *)in_RCX._M_current,(anon_class_8_1_54a39810 *)in_R8._M_current
              );
    AnchorGuard::~AnchorGuard(&local_30);
    Node::_rethrow_exception((Node *)in_RSI);
  }
  return;
}

Assistant:

void Executor::_corun_graph(Worker& w, Node* p, I first, I last) {

  // empty graph
  if(first == last) {
    return;
  }
  
  // anchor this parent as the blocking point
  {
    AnchorGuard anchor(p);
    _schedule_graph_with_parent(w, first, last, p);
    _corun_until(w, [p] () -> bool { 
      return p->_join_counter.load(std::memory_order_acquire) == 0; }
    );
  }

  // rethrow the exception to the blocker
  p->_rethrow_exception();
}